

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

int SaveConfigToStream(TidyDocImpl *doc,StreamOut *out)

{
  TidyOptionId TVar1;
  TidyOptionType TVar2;
  TidyAllocator *pTVar3;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var4;
  uint uVar5;
  int iVar6;
  tmbstr ptVar7;
  ulong uVar8;
  TidyOptionImpl *option;
  int iVar9;
  bool bVar10;
  tmbchar local_58 [40];
  
  option = option_defs;
  do {
    option = option + 1;
    iVar9 = 0;
    iVar6 = 0;
    if (option->parser != (ParseProperty *)0x0) {
      TVar1 = option->id;
      TVar2 = option->type;
      if (TVar2 == TidyString) {
        bVar10 = (ctmbstr)(doc->config).value[TVar1].v == option->pdflt;
      }
      else {
        bVar10 = (doc->config).value[TVar1].v == option->dflt;
      }
      iVar6 = iVar9;
      if ((!bVar10) || (TVar1 == TidyDoctype)) {
        if (TVar1 == TidyDoctype) {
          uVar8 = (doc->config).value[0xe].v;
          if (uVar8 != 2) {
            if (uVar8 != 5) goto LAB_00130d22;
            pTVar3 = doc->allocator;
            p_Var4 = pTVar3->vtbl->alloc;
            uVar5 = prvTidytmbstrlen((doc->config).value[TVar1].p);
            ptVar7 = (tmbstr)(*p_Var4)(pTVar3,(long)uVar5 + 2);
            if (ptVar7 != (tmbstr)0x0) {
              ptVar7[0] = '\"';
              ptVar7[1] = '\0';
              prvTidytmbstrcat(ptVar7,(doc->config).value[TVar1].p);
              prvTidytmbstrcat(ptVar7,"\"");
              WriteOptionString(option,ptVar7,out);
              (*doc->allocator->vtbl->free)(doc->allocator,ptVar7);
            }
          }
        }
        else if (option->pickList == (PickListItems *)0x0) {
          if (TVar2 == TidyBoolean) {
            ptVar7 = "yes";
            if ((doc->config).value[TVar1].v == 0) {
              ptVar7 = "no";
            }
          }
          else if (TVar2 == TidyInteger) {
            local_58[0x10] = '\0';
            local_58[0x11] = '\0';
            local_58[0x12] = '\0';
            local_58[0x13] = '\0';
            local_58[0x14] = '\0';
            local_58[0x15] = '\0';
            local_58[0x16] = '\0';
            local_58[0x17] = '\0';
            local_58[0x18] = '\0';
            local_58[0x19] = '\0';
            local_58[0x1a] = '\0';
            local_58[0x1b] = '\0';
            local_58[0x1c] = '\0';
            local_58[0x1d] = '\0';
            local_58[0x1e] = '\0';
            local_58[0x1f] = '\0';
            local_58[0] = '\0';
            local_58[1] = '\0';
            local_58[2] = '\0';
            local_58[3] = '\0';
            local_58[4] = '\0';
            local_58[5] = '\0';
            local_58[6] = '\0';
            local_58[7] = '\0';
            local_58[8] = '\0';
            local_58[9] = '\0';
            local_58[10] = '\0';
            local_58[0xb] = '\0';
            local_58[0xc] = '\0';
            local_58[0xd] = '\0';
            local_58[0xe] = '\0';
            local_58[0xf] = '\0';
            ptVar7 = local_58;
            prvTidytmbsnprintf(ptVar7,0x20,"%u",(ulong)*(uint *)((doc->config).value + TVar1));
          }
          else {
            if (TVar2 != TidyString) goto LAB_00130d91;
            ptVar7 = (doc->config).value[TVar1].p;
          }
          WriteOptionString(option,ptVar7,out);
          iVar6 = 0;
        }
        else {
          uVar8 = (ulong)*(uint *)((doc->config).value + TVar1);
LAB_00130d22:
          iVar6 = WriteOptionPick(option,(uint)uVar8,out);
        }
      }
    }
LAB_00130d91:
    if ((iVar6 != 0) || (option[1].name == (ctmbstr)0x0)) {
      return iVar6;
    }
  } while( true );
}

Assistant:

static int  SaveConfigToStream( TidyDocImpl* doc, StreamOut* out )
{
    int rc = 0;
    const TidyOptionImpl* option;
    for ( option=option_defs+1; 0==rc && option && option->name; ++option )
    {
        const TidyOptionValue* val = &doc->config.value[ option->id ];
        if ( option->parser == NULL )
            continue;
        if ( OptionValueEqDefault( option, val ) && option->id != TidyDoctype)
            continue;

        if ( option->id == TidyDoctype )  /* Special case */
        {
          ulong dtmode = cfg( doc, TidyDoctypeMode );
          if ( dtmode == TidyDoctypeUser )
          {
            tmbstr t;
            
            /* add 2 double quotes */
            if (( t = (tmbstr)TidyDocAlloc( doc, TY_(tmbstrlen)( val->p ) + 2 ) ))
            {
              t[0] = '\"'; t[1] = 0;
            
              TY_(tmbstrcat)( t, val->p );
              TY_(tmbstrcat)( t, "\"" );
              rc = WriteOptionString( option, t, out );
            
              TidyDocFree( doc, t );
            }
          }
          else if ( dtmode == option_defs[TidyDoctypeMode].dflt )
            continue;
          else
            rc = WriteOptionPick( option, dtmode, out );
        }
        else if ( option->pickList)
          rc = WriteOptionPick( option, val->v, out );
        else
        {
          switch ( option->type )
          {
          case TidyString:
            rc = WriteOptionString( option, val->p, out );
            break;
          case TidyInteger:
            rc = WriteOptionInt( option, val->v, out );
            break;
          case TidyBoolean:
            rc = WriteOptionBool( option, val->v ? yes : no, out );
            break;
          }
        }
    }
    return rc;
}